

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.c
# Opt level: O0

void get_options(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *__nptr;
  char *q;
  char *p;
  int i;
  char **argv_local;
  int argc_local;
  
  opt.server_addr = "localhost";
  opt.server_port = "4433";
  opt.listen_addr = "localhost";
  opt.listen_port = "5556";
  for (p._4_4_ = 1; p._4_4_ < argc; p._4_4_ = p._4_4_ + 1) {
    __s = argv[p._4_4_];
    pcVar5 = strchr(__s,0x3d);
    if (pcVar5 == (char *)0x0) {
      exit_usage(__s,(char *)0x0);
    }
    __nptr = pcVar5 + 1;
    *pcVar5 = '\0';
    iVar4 = strcmp(__s,"server_addr");
    pcVar5 = __nptr;
    pcVar1 = opt.server_port;
    pcVar2 = opt.listen_addr;
    pcVar3 = opt.listen_port;
    if ((((iVar4 != 0) &&
         (iVar4 = strcmp(__s,"server_port"), pcVar5 = opt.server_addr, pcVar1 = __nptr,
         pcVar2 = opt.listen_addr, pcVar3 = opt.listen_port, iVar4 != 0)) &&
        (iVar4 = strcmp(__s,"listen_addr"), pcVar5 = opt.server_addr, pcVar1 = opt.server_port,
        pcVar2 = __nptr, pcVar3 = opt.listen_port, iVar4 != 0)) &&
       (iVar4 = strcmp(__s,"listen_port"), pcVar5 = opt.server_addr, pcVar1 = opt.server_port,
       pcVar2 = opt.listen_addr, pcVar3 = __nptr, iVar4 != 0)) {
      iVar4 = strcmp(__s,"duplicate");
      if (iVar4 == 0) {
        opt.duplicate = atoi(__nptr);
        if ((opt.duplicate < 0) ||
           (pcVar5 = opt.server_addr, pcVar1 = opt.server_port, pcVar2 = opt.listen_addr,
           pcVar3 = opt.listen_port, 0x14 < opt.duplicate)) {
          exit_usage(__s,__nptr);
          pcVar5 = opt.server_addr;
          pcVar1 = opt.server_port;
          pcVar2 = opt.listen_addr;
          pcVar3 = opt.listen_port;
        }
      }
      else {
        iVar4 = strcmp(__s,"delay");
        if (iVar4 == 0) {
          opt.delay = atoi(__nptr);
          if (((opt.delay < 0) || (0x14 < opt.delay)) ||
             (pcVar5 = opt.server_addr, pcVar1 = opt.server_port, pcVar2 = opt.listen_addr,
             pcVar3 = opt.listen_port, opt.delay == 1)) {
            exit_usage(__s,__nptr);
            pcVar5 = opt.server_addr;
            pcVar1 = opt.server_port;
            pcVar2 = opt.listen_addr;
            pcVar3 = opt.listen_port;
          }
        }
        else {
          iVar4 = strcmp(__s,"delay_ccs");
          if (iVar4 == 0) {
            opt.delay_ccs = atoi(__nptr);
            if ((opt.delay_ccs < 0) ||
               (pcVar5 = opt.server_addr, pcVar1 = opt.server_port, pcVar2 = opt.listen_addr,
               pcVar3 = opt.listen_port, 1 < opt.delay_ccs)) {
              exit_usage(__s,__nptr);
              pcVar5 = opt.server_addr;
              pcVar1 = opt.server_port;
              pcVar2 = opt.listen_addr;
              pcVar3 = opt.listen_port;
            }
          }
          else {
            iVar4 = strcmp(__s,"drop");
            if (iVar4 == 0) {
              opt.drop = atoi(__nptr);
              if (((opt.drop < 0) || (0x14 < opt.drop)) ||
                 (pcVar5 = opt.server_addr, pcVar1 = opt.server_port, pcVar2 = opt.listen_addr,
                 pcVar3 = opt.listen_port, opt.drop == 1)) {
                exit_usage(__s,__nptr);
                pcVar5 = opt.server_addr;
                pcVar1 = opt.server_port;
                pcVar2 = opt.listen_addr;
                pcVar3 = opt.listen_port;
              }
            }
            else {
              iVar4 = strcmp(__s,"mtu");
              if (iVar4 == 0) {
                opt.mtu = atoi(__nptr);
                if ((opt.mtu < 0) ||
                   (pcVar5 = opt.server_addr, pcVar1 = opt.server_port, pcVar2 = opt.listen_addr,
                   pcVar3 = opt.listen_port, 0x4800 < opt.mtu)) {
                  exit_usage(__s,__nptr);
                  pcVar5 = opt.server_addr;
                  pcVar1 = opt.server_port;
                  pcVar2 = opt.listen_addr;
                  pcVar3 = opt.listen_port;
                }
              }
              else {
                iVar4 = strcmp(__s,"bad_ad");
                if (iVar4 == 0) {
                  opt.bad_ad = atoi(__nptr);
                  if ((opt.bad_ad < 0) ||
                     (pcVar5 = opt.server_addr, pcVar1 = opt.server_port, pcVar2 = opt.listen_addr,
                     pcVar3 = opt.listen_port, 1 < opt.bad_ad)) {
                    exit_usage(__s,__nptr);
                    pcVar5 = opt.server_addr;
                    pcVar1 = opt.server_port;
                    pcVar2 = opt.listen_addr;
                    pcVar3 = opt.listen_port;
                  }
                }
                else {
                  iVar4 = strcmp(__s,"protect_hvr");
                  if (iVar4 == 0) {
                    opt.protect_hvr = atoi(__nptr);
                    if ((opt.protect_hvr < 0) ||
                       (pcVar5 = opt.server_addr, pcVar1 = opt.server_port, pcVar2 = opt.listen_addr
                       , pcVar3 = opt.listen_port, 1 < opt.protect_hvr)) {
                      exit_usage(__s,__nptr);
                      pcVar5 = opt.server_addr;
                      pcVar1 = opt.server_port;
                      pcVar2 = opt.listen_addr;
                      pcVar3 = opt.listen_port;
                    }
                  }
                  else {
                    iVar4 = strcmp(__s,"protect_len");
                    if (iVar4 == 0) {
                      opt.protect_len = atoi(__nptr);
                      pcVar5 = opt.server_addr;
                      pcVar1 = opt.server_port;
                      pcVar2 = opt.listen_addr;
                      pcVar3 = opt.listen_port;
                      if (opt.protect_len < 0) {
                        exit_usage(__s,__nptr);
                        pcVar5 = opt.server_addr;
                        pcVar1 = opt.server_port;
                        pcVar2 = opt.listen_addr;
                        pcVar3 = opt.listen_port;
                      }
                    }
                    else {
                      iVar4 = strcmp(__s,"seed");
                      if (iVar4 == 0) {
                        opt.seed = atoi(__nptr);
                        pcVar5 = opt.server_addr;
                        pcVar1 = opt.server_port;
                        pcVar2 = opt.listen_addr;
                        pcVar3 = opt.listen_port;
                        if (opt.seed == 0) {
                          exit_usage(__s,__nptr);
                          pcVar5 = opt.server_addr;
                          pcVar1 = opt.server_port;
                          pcVar2 = opt.listen_addr;
                          pcVar3 = opt.listen_port;
                        }
                      }
                      else {
                        exit_usage(__s,(char *)0x0);
                        pcVar5 = opt.server_addr;
                        pcVar1 = opt.server_port;
                        pcVar2 = opt.listen_addr;
                        pcVar3 = opt.listen_port;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    opt.listen_port = pcVar3;
    opt.listen_addr = pcVar2;
    opt.server_port = pcVar1;
    opt.server_addr = pcVar5;
  }
  return;
}

Assistant:

static void get_options( int argc, char *argv[] )
{
    int i;
    char *p, *q;

    opt.server_addr    = DFL_SERVER_ADDR;
    opt.server_port    = DFL_SERVER_PORT;
    opt.listen_addr    = DFL_LISTEN_ADDR;
    opt.listen_port    = DFL_LISTEN_PORT;
    /* Other members default to 0 */

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            exit_usage( p, NULL );
        *q++ = '\0';

        if( strcmp( p, "server_addr" ) == 0 )
            opt.server_addr = q;
        else if( strcmp( p, "server_port" ) == 0 )
            opt.server_port = q;
        else if( strcmp( p, "listen_addr" ) == 0 )
            opt.listen_addr = q;
        else if( strcmp( p, "listen_port" ) == 0 )
            opt.listen_port = q;
        else if( strcmp( p, "duplicate" ) == 0 )
        {
            opt.duplicate = atoi( q );
            if( opt.duplicate < 0 || opt.duplicate > 20 )
                exit_usage( p, q );
        }
        else if( strcmp( p, "delay" ) == 0 )
        {
            opt.delay = atoi( q );
            if( opt.delay < 0 || opt.delay > 20 || opt.delay == 1 )
                exit_usage( p, q );
        }
        else if( strcmp( p, "delay_ccs" ) == 0 )
        {
            opt.delay_ccs = atoi( q );
            if( opt.delay_ccs < 0 || opt.delay_ccs > 1 )
                exit_usage( p, q );
        }
        else if( strcmp( p, "drop" ) == 0 )
        {
            opt.drop = atoi( q );
            if( opt.drop < 0 || opt.drop > 20 || opt.drop == 1 )
                exit_usage( p, q );
        }
        else if( strcmp( p, "mtu" ) == 0 )
        {
            opt.mtu = atoi( q );
            if( opt.mtu < 0 || opt.mtu > MAX_MSG_SIZE )
                exit_usage( p, q );
        }
        else if( strcmp( p, "bad_ad" ) == 0 )
        {
            opt.bad_ad = atoi( q );
            if( opt.bad_ad < 0 || opt.bad_ad > 1 )
                exit_usage( p, q );
        }
        else if( strcmp( p, "protect_hvr" ) == 0 )
        {
            opt.protect_hvr = atoi( q );
            if( opt.protect_hvr < 0 || opt.protect_hvr > 1 )
                exit_usage( p, q );
        }
        else if( strcmp( p, "protect_len" ) == 0 )
        {
            opt.protect_len = atoi( q );
            if( opt.protect_len < 0 )
                exit_usage( p, q );
        }
        else if( strcmp( p, "seed" ) == 0 )
        {
            opt.seed = atoi( q );
            if( opt.seed == 0 )
                exit_usage( p, q );
        }
        else
            exit_usage( p, NULL );
    }
}